

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

Weight ON_Font::FontWeightFromUnsigned(uint unsigned_font_weight)

{
  if (9 < unsigned_font_weight) {
    unsigned_font_weight = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1a00,"","unsigned_font_weight is not valid");
  }
  return (Weight)unsigned_font_weight;
}

Assistant:

ON_Font::Weight ON_Font::FontWeightFromUnsigned(
  unsigned int unsigned_font_weight
  )
{
  switch (unsigned_font_weight)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Thin);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Ultralight);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Light);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Normal);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Medium);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Semibold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Bold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Ultrabold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Heavy);
  default:
    break;
  }
  ON_ERROR("unsigned_font_weight is not valid");
  return ON_Font::Weight::Unset;
}